

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

bool __thiscall
soplex::SPxMainSM<double>::PostStep::checkBasisDim
          (PostStep *this,DataArray<soplex::SPxSolverBase<double>::VarStatus> *rows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cols)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = this->nRows;
  if ((long)iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(rows->data[lVar3] == BASIC);
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (0 < (long)this->nCols) {
    lVar3 = 0;
    do {
      iVar2 = iVar2 + (uint)(cols->data[lVar3] == BASIC);
      lVar3 = lVar3 + 1;
    } while (this->nCols != lVar3);
  }
  return iVar2 == iVar1;
}

Assistant:

bool SPxMainSM<R>::PostStep::checkBasisDim(DataArray<typename SPxSolverBase<R>::VarStatus> rows,
      DataArray<typename SPxSolverBase<R>::VarStatus> cols) const
{
   int numBasis = 0;

   for(int rs = 0; rs < nRows; ++rs)
   {
      if(rows[rs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   for(int cs = 0; cs < nCols; ++cs)
   {
      if(cols[cs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   assert(numBasis == nRows);
   return numBasis == nRows;
}